

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_instance_cache.cpp
# Opt level: O0

void background_thread_connect(duckdb_instance_cache instance_cache,char *path)

{
  StringRef capturedExpression;
  undefined8 in_RSI;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler_1;
  exception *ex;
  AssertionHandler catchAssertionHandler;
  duckdb_state state;
  duckdb_database out_database;
  undefined4 in_stack_fffffffffffffe08;
  Flags in_stack_fffffffffffffe0c;
  AssertionHandler *in_stack_fffffffffffffe10;
  StringRef *in_stack_fffffffffffffe18;
  AssertionHandler *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  SourceLineInfo *this;
  duckdb_state *in_stack_fffffffffffffe40;
  ExprLhs<const_duckdb_state_&> *in_stack_fffffffffffffe48;
  SourceLineInfo local_98;
  StringRef local_88;
  undefined4 local_1c;
  undefined1 local_18 [24];
  
  local_1c = duckdb_get_or_create_from_cache(in_RDI,in_RSI,local_18,0);
  local_88 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffe10,
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  this = &local_98;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_instance_cache.cpp"
             ,0xe);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
  capturedExpression.m_size = (size_type)this;
  capturedExpression.m_start = in_stack_fffffffffffffe28;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (SourceLineInfo *)in_stack_fffffffffffffe10,capturedExpression,
             in_stack_fffffffffffffe0c);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (duckdb_state *)0x45a8a7);
  Catch::ExprLhs<duckdb_state_const&>::operator==
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffe10,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  Catch::BinaryExpr<const_duckdb_state_&,_const_duckdb_state_&>::~BinaryExpr
            ((BinaryExpr<const_duckdb_state_&,_const_duckdb_state_&> *)0x45a909);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe10);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe10);
  duckdb_close(local_18);
  return;
}

Assistant:

static void background_thread_connect(duckdb_instance_cache instance_cache, const char *path) {
	try {
		duckdb_database out_database;
		auto state = duckdb_get_or_create_from_cache(instance_cache, path, &out_database, nullptr, nullptr);
		REQUIRE(state == DuckDBSuccess);
		duckdb_close(&out_database);
	} catch (std::exception &ex) {
		FAIL(ex.what());
	}
}